

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::print(JSPrinter *this,Ref node)

{
  ulong uVar1;
  undefined8 *puVar2;
  char *pcVar3;
  size_t *psVar4;
  JSPrinter *this_00;
  JSPrinter *this_01;
  Ref local_20;
  Ref node_local;
  ulong uVar5;
  
  local_20.inst = node.inst;
  ensure(this,100);
  switch((node.inst)->type) {
  case String:
    printName(this,node);
    return;
  case Number:
    printNum(this,node);
    return;
  case Assign_:
    printAssign(this,node);
    return;
  case AssignName_:
    printAssignName(this,node);
    return;
  }
  psVar4 = (size_t *)0x0;
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  if (*(int *)*puVar2 != 0) {
    __assert_fail("isString()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0xf0,"IString &cashew::Value::getIString()");
  }
  this_00 = *(JSPrinter **)((int *)*puVar2 + 4);
  switch(this_00->pretty) {
  case true:
    if (this_00 != __M_insert<void_const*>) {
LAB_00177758:
      abort();
    }
    printArray(this,local_20);
    break;
  case true:
    if (this_00 == HEAPU32) {
      printBinary(this,local_20);
    }
    else if (this_00 == _operator_) {
      printBlock(this,local_20);
    }
    else {
      if (this_00 != GT) goto LAB_00177758;
      printBreak(this,local_20);
    }
    break;
  case true:
    if (this_00 == DIV) {
      printCall(this,local_20);
    }
    else if (this_00 == _finalize) {
      printConditional(this,local_20);
    }
    else {
      if (this_00 != _finalize) goto LAB_00177758;
      printContinue(this,local_20);
    }
    break;
  case true:
    if (this_00 == ::wasm::ABI::wasm2js::ATOMIC_WAIT_I32) {
      printDefun(this,local_20);
    }
    else if (this_00 == ::wasm::ABI::wasm2js::MEMORY_INIT) {
      printDo(this,local_20);
    }
    else {
      if (this_00 != _finalize) goto LAB_00177758;
      printDot(this,local_20);
    }
    break;
  default:
    print(this_00);
    if (this_00->size < this_00->used + (long)(int)psVar4) {
      uVar1 = this_00->size * 2;
      uVar5 = 0x400;
      if (0x400 < uVar1) {
        uVar5 = uVar1;
      }
      this_01 = (JSPrinter *)(uVar5 + (long)(int)psVar4);
      this_00->size = (size_t)this_01;
      if (this_00->buffer == (char *)0x0) {
        pcVar3 = (char *)malloc((size_t)this_01);
        this_00->buffer = pcVar3;
        if (pcVar3 == (char *)0x0) goto LAB_001777e6;
      }
      else {
        pcVar3 = (char *)realloc(this_00->buffer,(size_t)this_01);
        if (pcVar3 == (char *)0x0) {
          psVar4 = &this_00->size;
          ensure();
LAB_001777e6:
          ensure(this_01);
          if ((int)*psVar4 == 0) {
            emit(this_01,(char *)psVar4[2]);
            return;
          }
          __assert_fail("isString()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                        ,0xec,"const char *cashew::Value::getCString()");
        }
        this_00->buffer = pcVar3;
      }
    }
    return;
  case true:
    if (this_00 != FOR) goto LAB_00177758;
    printIf(this,local_20);
    break;
  case true:
    if (this_00 != ATOMICS) goto LAB_00177758;
    printLabel(this,local_20);
    break;
  case true:
    if (this_00 != _VTT) goto LAB_00177758;
    printNew(this,local_20);
    break;
  case true:
    if (this_00 == _visitRefCast) {
      printObject(this,local_20);
    }
    break;
  case true:
    if (this_00 != WHILE) goto LAB_00177758;
    printReturn(this,local_20);
    break;
  case true:
    if (this_00 == _makeSigning) {
      printSub(this,local_20);
    }
    else if (this_00 == _finalize) {
      printSeq(this,local_20);
    }
    else if (this_00 == _visitTable) {
      printSwitch(this,local_20);
    }
    else {
      if (this_00 != _getByteSize) goto LAB_00177758;
      printString(this,local_20);
    }
    break;
  case true:
    if (this_00 == ___ostream_insert<char,std::char_traits<char>>) {
      printToplevel(this,local_20);
    }
    else {
      if (this_00 != _visitSelect) goto LAB_00177758;
      printTry(this,local_20);
    }
    break;
  case true:
    if (this_00 != _list) goto LAB_00177758;
    printUnaryPrefix(this,local_20);
    break;
  case true:
    if (this_00 != _finalize) goto LAB_00177758;
    printVar(this,local_20);
    break;
  case true:
    if (this_00 != ::wasm::ARRAY_BUFFER) goto LAB_00177758;
    printWhile(this,local_20);
  }
  return;
}

Assistant:

void print(Ref node) {
    ensure();
    if (node->isString()) {
      printName(node);
      return;
    }
    if (node->isNumber()) {
      printNum(node);
      return;
    }
    if (node->isAssignName()) {
      printAssignName(node);
      return;
    }
    if (node->isAssign()) {
      printAssign(node);
      return;
    }
    IString type = node[0]->getIString();
    switch (type.str[0]) {
      case 'a': {
        if (type == ARRAY) {
          printArray(node);
        } else {
          abort();
        }
        break;
      }
      case 'b': {
        if (type == BINARY) {
          printBinary(node);
        } else if (type == BLOCK) {
          printBlock(node);
        } else if (type == BREAK) {
          printBreak(node);
        } else {
          abort();
        }
        break;
      }
      case 'c': {
        if (type == CALL) {
          printCall(node);
        } else if (type == CONDITIONAL) {
          printConditional(node);
        } else if (type == CONTINUE) {
          printContinue(node);
        } else {
          abort();
        }
        break;
      }
      case 'd': {
        if (type == DEFUN) {
          printDefun(node);
        } else if (type == DO) {
          printDo(node);
        } else if (type == DOT) {
          printDot(node);
        } else {
          abort();
        }
        break;
      }
      case 'i': {
        if (type == IF) {
          printIf(node);
        } else {
          abort();
        }
        break;
      }
      case 'l': {
        if (type == LABEL) {
          printLabel(node);
        } else {
          abort();
        }
        break;
      }
      case 'n': {
        if (type == NEW) {
          printNew(node);
        } else {
          abort();
        }
        break;
      }
      case 'o': {
        if (type == OBJECT) {
          printObject(node);
        }
        break;
      }
      case 'r': {
        if (type == RETURN) {
          printReturn(node);
        } else {
          abort();
        }
        break;
      }
      case 's': {
        if (type == SUB) {
          printSub(node);
        } else if (type == SEQ) {
          printSeq(node);
        } else if (type == SWITCH) {
          printSwitch(node);
        } else if (type == STRING) {
          printString(node);
        } else {
          abort();
        }
        break;
      }
      case 't': {
        if (type == TOPLEVEL) {
          printToplevel(node);
        } else if (type == TRY) {
          printTry(node);
        } else {
          abort();
        }
        break;
      }
      case 'u': {
        if (type == UNARY_PREFIX) {
          printUnaryPrefix(node);
        } else {
          abort();
        }
        break;
      }
      case 'v': {
        if (type == VAR) {
          printVar(node);
        } else {
          abort();
        }
        break;
      }
      case 'w': {
        if (type == WHILE) {
          printWhile(node);
        } else {
          abort();
        }
        break;
      }
      default: {
        errv("cannot yet print %s\n", type.str.data());
        abort();
      }
    }
  }